

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void djb::spline::uwrap_repeat(float_t u,int s,int *x,int *y,float_t *w)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  float fVar3;
  float_t intpart;
  float local_34;
  
  local_34 = (float)((ulong)in_RAX >> 0x20);
  fVar3 = modff(u * (float)s,&local_34);
  iVar1 = iwrap_repeat((int)local_34,s);
  *x = iVar1;
  iVar2 = (uint)(0.0 < fVar3) - (uint)(fVar3 < 0.0);
  iVar1 = iwrap_repeat((int)local_34 + iVar2,s);
  *y = iVar1;
  *w = (float)iVar2 * fVar3;
  return;
}

Assistant:

void uwrap_repeat(float_t u, int s, int *x, int *y, float_t *w)
{
	float_t intpart; float_t frac = modf(u * s, &intpart);
	(*x) = iwrap_repeat((int)intpart            , s);
	(*y) = iwrap_repeat((int)intpart + sgn(frac), s);
	(*w) = frac * sgn(frac);
}